

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dgPolyhedra.cpp
# Opt level: O1

bool __thiscall dgPolyhedra::GetConectedSurface(dgPolyhedra *this,dgPolyhedra *polyhedra)

{
  int iVar1;
  dgTreeNode *this_00;
  HaI32 *pHVar2;
  long lVar3;
  undefined8 *__ptr;
  long lVar4;
  HaI32 *pHVar5;
  int iVar6;
  int iVar7;
  dgRedBackNode *pdVar8;
  bool bVar9;
  Iterator iter;
  HaI32 faceIndex [4096];
  HaI64 faceDataIndex [4096];
  Iterator local_c048;
  HaI32 local_c038 [4096];
  HaI64 local_8038 [4097];
  
  if ((this->super_dgTree<dgEdge,_long>).m_count == 0) {
    bVar9 = false;
  }
  else {
    local_c048.m_ptr = (dgRedBackNode *)0x0;
    this_00 = (this->super_dgTree<dgEdge,_long>).m_head;
    local_c048.m_tree = &this->super_dgTree<dgEdge,_long>;
    if (this_00 == (dgTreeNode *)0x0) {
      local_c048.m_ptr = (dgRedBackNode *)0x0;
    }
    else {
      local_c048.m_ptr = dgRedBackNode::Minimum(&this_00->super_dgRedBackNode);
    }
    bVar9 = local_c048.m_ptr != (dgRedBackNode *)0x0;
    if (local_c048.m_ptr == (dgRedBackNode *)0x0) {
      pdVar8 = (dgRedBackNode *)0x0;
    }
    else {
      if (this->m_baseMark <= *(int *)&local_c048.m_ptr[2]._vptr_dgRedBackNode) goto LAB_0087bf9b;
      iVar6 = *(int *)((long)&local_c048.m_ptr[1]._vptr_dgRedBackNode + 4);
      while (iVar6 < 1) {
LAB_0087bf9b:
        do {
          pdVar8 = local_c048.m_ptr;
          dgTree<dgEdge,_long>::Iterator::operator++(&local_c048,0);
          bVar9 = local_c048.m_ptr != (dgRedBackNode *)0x0;
          if (!bVar9) {
            pdVar8 = pdVar8 + 1;
            goto LAB_0087bfc1;
          }
        } while (this->m_baseMark <= *(int *)&local_c048.m_ptr[2]._vptr_dgRedBackNode);
        iVar6 = *(int *)((long)&local_c048.m_ptr[1]._vptr_dgRedBackNode + 4);
      }
      pdVar8 = local_c048.m_ptr + 1;
    }
LAB_0087bfc1:
    if (bVar9 != false) {
      iVar6 = (this->super_dgTree<dgEdge,_long>).m_count;
      __ptr = (undefined8 *)malloc((long)(iVar6 * 8));
      if (iVar6 < 0) {
        __assert_fail("(entry < m_size) || ((m_size == 0) && (entry == 0))",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/cecilysunday[P]chrono/src/chrono_thirdparty/HACDv2/dgStack.h"
                      ,0x60,"T &dgStack<dgEdge *>::operator[](hacd::HaI32) [T = dgEdge *]");
      }
      iVar6 = this->m_edgeMark + 1;
      this->m_edgeMark = iVar6;
      if (iVar6 == 0x7fffffff) {
        __assert_fail("m_edgeMark < 0x7fffffff",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/cecilysunday[P]chrono/src/chrono_thirdparty/HACDv2/dgPolyhedra.h"
                      ,0xe5,"hacd::HaI32 dgPolyhedra::IncLRU() const");
      }
      *__ptr = pdVar8;
      iVar7 = 1;
      do {
        lVar4 = (long)iVar7;
        iVar7 = iVar7 + -1;
        pHVar2 = (HaI32 *)__ptr[lVar4 + -1];
        if (pHVar2[10] != iVar6) {
          iVar1 = (this->super_dgTree<dgEdge,_long>).m_count;
          lVar4 = 0;
          pHVar5 = pHVar2;
          do {
            pHVar5[10] = iVar6;
            local_c038[lVar4] = *pHVar5;
            local_8038[lVar4] = *(HaI64 *)(pHVar5 + 2);
            if (lVar4 == 0xfff) {
              __assert_fail("count < hacd::HaI32 ((sizeof (faceIndex)/sizeof(faceIndex[0])))",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/cecilysunday[P]chrono/src/chrono_thirdparty/HACDv2/dgPolyhedra.cpp"
                            ,0x8cb,"bool dgPolyhedra::GetConectedSurface(dgPolyhedra &) const");
            }
            lVar3 = *(long *)(pHVar5 + 8);
            if ((0 < *(int *)(lVar3 + 4)) && (*(int *)(lVar3 + 0x28) != iVar6)) {
              __ptr[iVar7] = lVar3;
              iVar7 = iVar7 + 1;
              if (iVar1 <= iVar7) {
                __assert_fail("index < GetCount()",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/cecilysunday[P]chrono/src/chrono_thirdparty/HACDv2/dgPolyhedra.cpp"
                              ,0x8d0,"bool dgPolyhedra::GetConectedSurface(dgPolyhedra &) const");
              }
            }
            pHVar5 = *(HaI32 **)(pHVar5 + 4);
            lVar4 = lVar4 + 1;
          } while (pHVar5 != pHVar2);
          AddFace(polyhedra,(HaI32)lVar4,local_c038,local_8038);
        }
      } while (iVar7 != 0);
      EndFace(polyhedra);
      free(__ptr);
    }
  }
  return bVar9;
}

Assistant:

bool dgPolyhedra::GetConectedSurface (dgPolyhedra &polyhedra) const
{
	if (!GetCount()) {
		return false;
	}

	dgEdge* edge = NULL;
	Iterator iter(*this);
	for (iter.Begin (); iter; iter ++) {
		edge = &(*iter);
		if ((edge->m_mark < m_baseMark) && (edge->m_incidentFace > 0)) {
			break;
		}
	}

	if (!iter) {
		return false;
	}

	hacd::HaI32 faceIndex[4096];
	hacd::HaI64 faceDataIndex[4096];
	dgStack<dgEdge*> stackPool (GetCount()); 
	dgEdge** const stack = &stackPool[0];

	hacd::HaI32 mark = IncLRU();

	polyhedra.BeginFace ();
	stack[0] = edge;
	hacd::HaI32 index = 1;
	while (index) {
		index --;
		dgEdge* const edge = stack[index];

		if (edge->m_mark == mark) {
			continue;
		}

		hacd::HaI32 count = 0;
		dgEdge* ptr = edge;
		do {
			ptr->m_mark = mark;
			faceIndex[count] = ptr->m_incidentVertex;
			faceDataIndex[count] = hacd::HaI64 (ptr->m_userData);
			count ++;
			HACD_ASSERT (count <  hacd::HaI32 ((sizeof (faceIndex)/sizeof(faceIndex[0]))));

			if ((ptr->m_twin->m_incidentFace > 0) && (ptr->m_twin->m_mark != mark)) {
				stack[index] = ptr->m_twin;
				index ++;
				HACD_ASSERT (index < GetCount());
			}

			ptr = ptr->m_next;
		} while (ptr != edge);

		polyhedra.AddFace (count, &faceIndex[0], &faceDataIndex[0]);
	}

	polyhedra.EndFace ();

	return true;
}